

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# D2xNvmFlash.cpp
# Opt level: O3

void __thiscall D2xNvmFlash::writePage(D2xNvmFlash *this,uint32_t page)

{
  WordCopyApplet *this_00;
  bool *pbVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  undefined8 *puVar4;
  
  if (page < (this->super_Flash)._pages) {
    uVar2 = Samba::readWord((this->super_Flash)._samba,0x41004004);
    Samba::writeWord((this->super_Flash)._samba,0x41004004,uVar2 | 0x40080);
    if (((page & 3) == 0) && ((this->super_Flash).field_0xf4 != '\0')) {
      uVar2 = (this->super_Flash)._size;
      erase(this,uVar2 * page,uVar2 << 2);
    }
    command(this,'D');
    uVar2 = page * (this->super_Flash)._size + (this->super_Flash)._addr;
    this_00 = &(this->super_Flash)._wordCopy;
    WordCopyApplet::setDstAddr(this_00,uVar2);
    WordCopyApplet::setSrcAddr
              (this_00,(&(this->super_Flash)._pageBufferA)[(this->super_Flash)._onBufferA ^ 1]);
    pbVar1 = &(this->super_Flash)._onBufferA;
    *pbVar1 = (bool)(*pbVar1 ^ 1);
    do {
      uVar3 = Samba::readWord((this->super_Flash)._samba,0x41004014);
    } while ((uVar3 & 1) == 0);
    Applet::runv(&this_00->super_Applet);
    Samba::writeWord((this->super_Flash)._samba,0x4100401c,uVar2 >> 1);
    command(this,'\x04');
    return;
  }
  puVar4 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar4 = &PTR__exception_001187a0;
  __cxa_throw(puVar4,&FlashPageError::typeinfo,std::exception::~exception);
}

Assistant:

void
D2xNvmFlash::writePage(uint32_t page)
{
    if (page >= _pages)
    {
        throw FlashPageError();
    }

    // Disable cache and configure manual page write
    writeReg(NVM_REG_CTRLB, readReg(NVM_REG_CTRLB) | (0x1 << 18) | (0x1 << 7));

    // Auto-erase if writing at the start of the erase page
    if (_eraseAuto && page % ERASE_ROW_PAGES == 0)
        erase(page * _size, ERASE_ROW_PAGES * _size);

    // Clear page buffer
    command(NVM_CMD_PBC);

    // Compute the start address.
    uint32_t addr = _addr + (page * _size);

    _wordCopy.setDstAddr(addr);
    _wordCopy.setSrcAddr(_onBufferA ? _pageBufferA : _pageBufferB);
    _onBufferA = !_onBufferA;
    waitReady();
    _wordCopy.runv();

    writeReg(NVM_REG_ADDR, addr / 2);
    command(NVM_CMD_WP);
}